

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::ClearTexData(ImFontAtlas *this)

{
  if (this->Locked != true) {
    if (this->TexPixelsAlpha8 != (uchar *)0x0) {
      ImGui::MemFree(this->TexPixelsAlpha8);
    }
    if (this->TexPixelsRGBA32 != (uint *)0x0) {
      ImGui::MemFree(this->TexPixelsRGBA32);
    }
    this->TexPixelsAlpha8 = (uchar *)0x0;
    this->TexPixelsRGBA32 = (uint *)0x0;
    return;
  }
  __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_draw.cpp"
                ,0x5c9,"void ImFontAtlas::ClearTexData()");
}

Assistant:

void    ImFontAtlas::ClearTexData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    if (TexPixelsAlpha8)
        IM_FREE(TexPixelsAlpha8);
    if (TexPixelsRGBA32)
        IM_FREE(TexPixelsRGBA32);
    TexPixelsAlpha8 = NULL;
    TexPixelsRGBA32 = NULL;
}